

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_creature_abstract::state_read
          (cse_alife_creature_abstract *this,xr_packet *packet,uint16_t size)

{
  ushort version;
  size_t sVar1;
  ulong in_RAX;
  ulong uVar2;
  uint value;
  uint value_1;
  undefined8 local_38;
  
  local_38 = in_RAX;
  cse_alife_dynamic_object_visual::state_read((cse_alife_dynamic_object_visual *)this,packet,0);
  xr_packet::r_raw(packet,&this->m_s_team,1);
  xr_packet::r_raw(packet,&this->m_s_squad,1);
  xr_packet::r_raw(packet,&this->m_s_group,1);
  if (0x12 < *(ushort *)&this->field_0x28) {
    xr_packet::r_raw(packet,&this->m_health,4);
  }
  version = *(ushort *)&this->field_0x28;
  if (version < 0x73) {
    this->m_health = this->m_health * 0.01;
  }
  if (version < 0x20) {
    cse_visual::visual_read((cse_visual *)&this->field_0x118,packet,version);
  }
  if (0x57 < *(ushort *)&this->field_0x28) {
    xr_packet::r_raw(packet,&local_38,4);
    uVar2 = local_38 & 0xffffffff;
    sVar1 = packet->m_r_pos;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (&this->m_dynamic_out_restrictions,uVar2);
    std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_assign_aux<unsigned_short_const*>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)
               &this->m_dynamic_out_restrictions,packet->m_buf + sVar1,
               packet->m_buf + sVar1 + uVar2 * 2);
    packet->m_r_pos = packet->m_r_pos + uVar2 * 2;
    xr_packet::r_raw(packet,(void *)((long)&local_38 + 4),4);
    uVar2 = (ulong)local_38._4_4_;
    sVar1 = packet->m_r_pos;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (&this->m_dynamic_in_restrictions,uVar2);
    std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_assign_aux<unsigned_short_const*>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)
               &this->m_dynamic_in_restrictions,packet->m_buf + sVar1,
               packet->m_buf + sVar1 + uVar2 * 2);
    packet->m_r_pos = packet->m_r_pos + uVar2 * 2;
  }
  if (0x5e < *(ushort *)&this->field_0x28) {
    xr_packet::r_raw(packet,&this->m_killer_id,2);
  }
  uVar2 = *(ulong *)&this->field_0x6c << 0x20 | *(ulong *)&this->field_0x6c >> 0x20;
  (this->m_o_torso).yaw = (float)(int)uVar2;
  (this->m_o_torso).pitch = (float)(int)(uVar2 >> 0x20);
  if (0x73 < *(ushort *)&this->field_0x28) {
    xr_packet::r_raw(packet,&this->m_game_death_time,8);
  }
  return;
}

Assistant:

void cse_alife_creature_abstract::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	packet.r_u8(m_s_team);
	packet.r_u8(m_s_squad);
	packet.r_u8(m_s_group);
	if (m_version > CSE_VERSION_0x12)
		packet.r_float(m_health);
	if (m_version < CSE_VERSION_0x73)
		m_health *= 0.01f;
	if (m_version < CSE_VERSION_0x20)
		cse_visual::visual_read(packet, m_version);
	if (m_version > CSE_VERSION_0x57) {
		packet.r_seq(packet.r_u32(), m_dynamic_out_restrictions);
		packet.r_seq(packet.r_u32(), m_dynamic_in_restrictions);
	}
	if (m_version > CSE_VERSION_0x5e)
		packet.r_u16(m_killer_id);
	m_o_torso.yaw = m_o_angle.y;
	m_o_torso.pitch = m_o_angle.x;
	if (m_version > CSE_VERSION_0x73)
		packet.r_u64(m_game_death_time);
}